

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

FileDescriptor * __thiscall
google::protobuf::DescriptorPool::FindFileByName(DescriptorPool *this,ConstStringParam name)

{
  Tables *pTVar1;
  pointer pcVar2;
  size_t sVar3;
  StringPiece name_00;
  bool bVar4;
  const_iterator cVar5;
  FileDescriptor *pFVar6;
  MutexLockMaybe lock;
  MutexLockMaybe local_40;
  key_type local_38;
  
  internal::MutexLockMaybe::MutexLockMaybe(&local_40,this->mutex_);
  if (this->fallback_database_ != (DescriptorDatabase *)0x0) {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::clear(&(((this->tables_)._M_t.
               super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
               .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
              _M_head_impl)->known_bad_symbols_)._M_h);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::clear(&(((this->tables_)._M_t.
               super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
               .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
              _M_head_impl)->known_bad_files_)._M_h);
  }
  pTVar1 = (this->tables_)._M_t.
           super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
           .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>._M_head_impl;
  pcVar2 = (name->_M_dataplus)._M_p;
  sVar3 = name->_M_string_length;
  if ((long)sVar3 < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig(sVar3,"string length exceeds max size");
  }
  local_38.ptr_ = pcVar2;
  local_38.length_ = sVar3;
  cVar5 = std::
          _Hashtable<google::protobuf::stringpiece_internal::StringPiece,_std::pair<const_google::protobuf::stringpiece_internal::StringPiece,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::stringpiece_internal::StringPiece,_const_google::protobuf::FileDescriptor_*>_>,_std::__detail::_Select1st,_std::equal_to<google::protobuf::stringpiece_internal::StringPiece>,_google::protobuf::hash<google::protobuf::stringpiece_internal::StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(pTVar1->files_by_name_)._M_h,&local_38);
  if (cVar5.
      super__Node_iterator_base<std::pair<const_google::protobuf::stringpiece_internal::StringPiece,_const_google::protobuf::FileDescriptor_*>,_true>
      ._M_cur == (__node_type *)0x0) {
    pFVar6 = (FileDescriptor *)0x0;
  }
  else {
    pFVar6 = *(FileDescriptor **)
              ((long)cVar5.
                     super__Node_iterator_base<std::pair<const_google::protobuf::stringpiece_internal::StringPiece,_const_google::protobuf::FileDescriptor_*>,_true>
                     ._M_cur + 0x18);
  }
  if (pFVar6 == (FileDescriptor *)0x0) {
    if (this->underlay_ != (DescriptorPool *)0x0) {
      pFVar6 = FindFileByName(this->underlay_,name);
      if (pFVar6 != (FileDescriptor *)0x0) goto LAB_0034c677;
    }
    name_00.ptr_ = (name->_M_dataplus)._M_p;
    name_00.length_ = name->_M_string_length;
    if ((long)name->_M_string_length < 0) {
      stringpiece_internal::StringPiece::LogFatalSizeTooBig
                (name->_M_string_length,"string length exceeds max size");
    }
    bVar4 = TryFindFileInFallbackDatabase(this,name_00);
    if (bVar4) {
      pTVar1 = (this->tables_)._M_t.
               super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
               .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
               _M_head_impl;
      pcVar2 = (name->_M_dataplus)._M_p;
      sVar3 = name->_M_string_length;
      if ((long)sVar3 < 0) {
        stringpiece_internal::StringPiece::LogFatalSizeTooBig
                  (sVar3,"string length exceeds max size");
      }
      local_38.ptr_ = pcVar2;
      local_38.length_ = sVar3;
      cVar5 = std::
              _Hashtable<google::protobuf::stringpiece_internal::StringPiece,_std::pair<const_google::protobuf::stringpiece_internal::StringPiece,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::stringpiece_internal::StringPiece,_const_google::protobuf::FileDescriptor_*>_>,_std::__detail::_Select1st,_std::equal_to<google::protobuf::stringpiece_internal::StringPiece>,_google::protobuf::hash<google::protobuf::stringpiece_internal::StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(pTVar1->files_by_name_)._M_h,&local_38);
      if (cVar5.
          super__Node_iterator_base<std::pair<const_google::protobuf::stringpiece_internal::StringPiece,_const_google::protobuf::FileDescriptor_*>,_true>
          ._M_cur == (__node_type *)0x0) {
        pFVar6 = (FileDescriptor *)0x0;
      }
      else {
        pFVar6 = *(FileDescriptor **)
                  ((long)cVar5.
                         super__Node_iterator_base<std::pair<const_google::protobuf::stringpiece_internal::StringPiece,_const_google::protobuf::FileDescriptor_*>,_true>
                         ._M_cur + 0x18);
      }
      if (pFVar6 != (FileDescriptor *)0x0) goto LAB_0034c677;
    }
    pFVar6 = (FileDescriptor *)0x0;
  }
LAB_0034c677:
  if ((pthread_mutex_t *)local_40.mu_ != (pthread_mutex_t *)0x0) {
    pthread_mutex_unlock((pthread_mutex_t *)local_40.mu_);
  }
  return pFVar6;
}

Assistant:

const FileDescriptor* DescriptorPool::FindFileByName(
    ConstStringParam name) const {
  MutexLockMaybe lock(mutex_);
  if (fallback_database_ != nullptr) {
    tables_->known_bad_symbols_.clear();
    tables_->known_bad_files_.clear();
  }
  const FileDescriptor* result = tables_->FindFile(name);
  if (result != nullptr) return result;
  if (underlay_ != nullptr) {
    result = underlay_->FindFileByName(name);
    if (result != nullptr) return result;
  }
  if (TryFindFileInFallbackDatabase(name)) {
    result = tables_->FindFile(name);
    if (result != nullptr) return result;
  }
  return nullptr;
}